

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binstrrcaseless(const_bstring b1,int pos,const_bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  __int32_t **pp_Var6;
  int iVar7;
  long lVar8;
  uchar *puVar9;
  
  iVar7 = -1;
  if (((((b1 != (const_bstring)0x0) && (puVar9 = b1->data, puVar9 != (uchar *)0x0)) &&
       (uVar5 = b1->slen, b2 != (const_bstring)0x0 && -1 < (int)uVar5)) &&
      ((puVar4 = b2->data, puVar4 != (uchar *)0x0 && (uVar3 = b2->slen, -1 < (int)uVar3)))) &&
     (iVar7 = pos, uVar5 != pos || uVar3 != 0)) {
    if (uVar5 < (uint)pos) {
      iVar7 = -1;
    }
    if (((uVar5 >= (uint)pos && uVar3 != 0) &&
        (iVar7 = 0, (pos != 0 || puVar9 != puVar4) || uVar5 < uVar3)) &&
       (uVar5 = uVar5 - uVar3, iVar7 = -1, -1 < (int)uVar5)) {
      if (uVar5 < (uint)pos) {
        pos = uVar5;
      }
      puVar9 = puVar9 + pos;
      while( true ) {
        lVar8 = 0;
        while( true ) {
          bVar1 = puVar4[lVar8];
          bVar2 = puVar9[lVar8];
          if ((bVar1 != bVar2) &&
             (pp_Var6 = __ctype_tolower_loc(), (*pp_Var6)[bVar1] != (*pp_Var6)[bVar2])) break;
          lVar8 = lVar8 + 1;
          if ((int)uVar3 <= (int)lVar8) {
            return pos;
          }
        }
        if (pos < 1) break;
        pos = pos - 1;
        puVar9 = puVar9 + -1;
      }
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int binstrrcaseless (const_bstring b1, int pos, const_bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen)
		return BSTR_OK;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}